

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

int If_DsdObjCreate(If_DsdMan_t *p,int Type,int *pLits,int nLits,int truthId)

{
  uint *puVar1;
  void *pvVar2;
  int iVar3;
  If_DsdObj_t *pIVar4;
  uint uVar5;
  ulong uVar6;
  
  if (nLits != 3 && Type == 5) {
    __assert_fail("Type != DAU_DSD_MUX || nLits == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                  ,0x3c3,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
  }
  if (Type == 5) {
    if (pLits[1] < 0) {
LAB_003a188c:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf3,"int Abc_LitIsCompl(int)");
    }
    if ((pLits[1] & 1U) != 0) {
      if (pLits[2] < 0) goto LAB_003a188c;
      if ((pLits[2] & 1U) != 0) {
        __assert_fail("Type != DAU_DSD_MUX || !Abc_LitIsCompl(pLits[1]) || !Abc_LitIsCompl(pLits[2])"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                      ,0x3c5,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
      }
    }
  }
  if (0 < nLits && Type - 3U < 2) {
    iVar3 = -1;
    uVar6 = 0;
    do {
      uVar5 = pLits[uVar6];
      if ((int)uVar5 < 0) goto LAB_003a17b3;
      if ((p->vObjs).nSize <= (int)(uVar5 >> 1)) goto LAB_003a1794;
      pvVar2 = (p->vObjs).pArray[uVar5 >> 1];
      if (Type == 4) {
        if ((*(uint *)((long)pvVar2 + 4) & 7) == 4) {
          __assert_fail("Type != DAU_DSD_XOR || If_DsdObjType(pFanin) != DAU_DSD_XOR",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                        ,0x3cd,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
        }
      }
      else if (((Type == 3) && ((uVar5 & 1) == 0)) && ((*(uint *)((long)pvVar2 + 4) & 7) == 3)) {
        __assert_fail("Type != DAU_DSD_AND || Abc_LitIsCompl(pLits[i]) || If_DsdObjType(pFanin) != DAU_DSD_AND"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                      ,0x3cc,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
      }
      if ((iVar3 != -1) && (iVar3 = If_DsdObjCompare(p,&p->vObjs,iVar3,uVar5), 0 < iVar3)) {
        __assert_fail("iPrev == -1 || If_DsdObjCompare(p, &p->vObjs, iPrev, pLits[i]) <= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                      ,0x3ce,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
      }
      iVar3 = pLits[uVar6];
      uVar6 = uVar6 + 1;
    } while ((uint)nLits != uVar6);
  }
  pIVar4 = If_DsdObjAlloc(p,Type,nLits);
  if (Type == 6) {
    if ((*(uint *)&pIVar4->field_0x4 < 0x18000000) || ((*(uint *)&pIVar4->field_0x4 & 7) != 6)) {
      __assert_fail("pObj->Type == IF_DSD_PRIME && pObj->nFans > 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                    ,0x74,"void If_DsdObjSetTruth(If_DsdMan_t *, If_DsdObj_t *, int)");
    }
    uVar5 = pIVar4->Id;
    if (((long)(int)uVar5 < 0) || ((p->vTruths).nSize <= (int)uVar5)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (p->vTruths).pArray[(int)uVar5] = truthId;
  }
  if ((pIVar4->field_0x4 & 0xf8) != 0) {
    __assert_fail("pObj->nSupp == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDsd.c"
                  ,0x3d6,"int If_DsdObjCreate(If_DsdMan_t *, int, int *, int, int)");
  }
  if (0 < nLits) {
    uVar6 = 0;
    do {
      (&pIVar4[1].Id)[uVar6] = pLits[uVar6];
      if (pLits[uVar6] < 0) {
LAB_003a17b3:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      uVar5 = (uint)pLits[uVar6] >> 1;
      if ((p->vObjs).nSize <= (int)uVar5) goto LAB_003a1794;
      *(uint *)&pIVar4->field_0x4 =
           *(uint *)&pIVar4->field_0x4 & 0xffffff07 |
           (*(uint *)((long)(p->vObjs).pArray[uVar5] + 4) & 0xf8) + *(uint *)&pIVar4->field_0x4 &
           0xf8;
      uVar6 = uVar6 + 1;
    } while ((uint)nLits != uVar6);
  }
  if (p->LutSize != 0) {
    if ((int)pIVar4->Id < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf1,"int Abc_Var2Lit(int, int)");
    }
    uVar5 = If_DsdManCheckXY_int(p,pIVar4->Id * 2,p->LutSize,0,0,0);
    if (uVar5 == 0) {
      uVar5 = pIVar4->Id;
      if (((long)(int)uVar5 < 0) || ((p->vObjs).nSize <= (int)uVar5)) {
LAB_003a1794:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (uint *)((long)(p->vObjs).pArray[(int)uVar5] + 4);
      *puVar1 = *puVar1 | 0x100;
    }
  }
  return pIVar4->Id;
}

Assistant:

int If_DsdObjCreate( If_DsdMan_t * p, int Type, int * pLits, int nLits, int truthId )
{
    If_DsdObj_t * pObj, * pFanin;
    int i, iPrev = -1;
    // check structural canonicity
    assert( Type != DAU_DSD_MUX || nLits == 3 );
//    assert( Type != DAU_DSD_MUX || !Abc_LitIsCompl(pLits[0]) );
    assert( Type != DAU_DSD_MUX || !Abc_LitIsCompl(pLits[1]) || !Abc_LitIsCompl(pLits[2]) );
    // check that leaves are in good order
    if ( Type == DAU_DSD_AND || Type == DAU_DSD_XOR )
    {
        for ( i = 0; i < nLits; i++ )
        {
            pFanin = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(pLits[i]) );
            assert( Type != DAU_DSD_AND || Abc_LitIsCompl(pLits[i]) || If_DsdObjType(pFanin) != DAU_DSD_AND );
            assert( Type != DAU_DSD_XOR || If_DsdObjType(pFanin) != DAU_DSD_XOR );
            assert( iPrev == -1 || If_DsdObjCompare(p, &p->vObjs, iPrev, pLits[i]) <= 0 );
            iPrev = pLits[i];
        }
    }
    // create new node
    pObj = If_DsdObjAlloc( p, Type, nLits );
    if ( Type == DAU_DSD_PRIME )
        If_DsdObjSetTruth( p, pObj, truthId );
    assert( pObj->nSupp == 0 );
    for ( i = 0; i < nLits; i++ )
    {
        pObj->pFans[i] = pLits[i];
        pObj->nSupp += If_DsdVecLitSuppSize(&p->vObjs, pLits[i]);
    }
    // check decomposability
    if ( p->LutSize && !If_DsdManCheckXY(p, Abc_Var2Lit(pObj->Id, 0), p->LutSize, 0, 0, 0, 0) )
        If_DsdVecObjSetMark( &p->vObjs, pObj->Id );
    return pObj->Id;
}